

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitDepthStencilCase::BlitDepthStencilCase
          (BlitDepthStencilCase *this,Context *context,char *name,char *desc,deUint32 format,
          deUint32 srcBuffers,IVec2 *srcSize,IVec4 *srcRect,deUint32 dstBuffers,IVec2 *dstSize,
          IVec4 *dstRect,deUint32 copyBuffers)

{
  deUint32 srcBuffers_local;
  deUint32 format_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BlitDepthStencilCase *this_local;
  
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,desc,false);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlitDepthStencilCase_015ae090;
  this->m_format = format;
  this->m_srcBuffers = srcBuffers;
  tcu::Vector<int,_2>::Vector(&this->m_srcSize,srcSize);
  tcu::Vector<int,_4>::Vector(&this->m_srcRect,srcRect);
  this->m_dstBuffers = dstBuffers;
  tcu::Vector<int,_2>::Vector(&this->m_dstSize,dstSize);
  tcu::Vector<int,_4>::Vector(&this->m_dstRect,dstRect);
  this->m_copyBuffers = copyBuffers;
  return;
}

Assistant:

BlitDepthStencilCase (Context& context, const char* name, const char* desc, deUint32 format, deUint32 srcBuffers, const IVec2& srcSize, const IVec4& srcRect, deUint32 dstBuffers, const IVec2& dstSize, const IVec4& dstRect, deUint32 copyBuffers)
		: FboTestCase	(context, name, desc)
		, m_format		(format)
		, m_srcBuffers	(srcBuffers)
		, m_srcSize		(srcSize)
		, m_srcRect		(srcRect)
		, m_dstBuffers	(dstBuffers)
		, m_dstSize		(dstSize)
		, m_dstRect		(dstRect)
		, m_copyBuffers	(copyBuffers)
	{
	}